

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorShader.cpp
# Opt level: O2

DecoratorDataHandle __thiscall
Rml::DecoratorShader::GenerateElementData(DecoratorShader *this,Element *element,BoxArea paint_area)

{
  RenderManager *mesh_00;
  ComputedValues *pCVar1;
  pointer pVVar2;
  ShaderElementData *pSVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  allocator_type local_193;
  key_compare local_192;
  allocator<char> local_191;
  Vector2f dimensions;
  CompiledShader shader;
  undefined1 local_178 [64];
  Dictionary local_138;
  Mesh mesh;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_d0;
  Variant local_80;
  RenderBox render_box;
  
  mesh_00 = Element::GetRenderManager(element);
  if (mesh_00 == (RenderManager *)0x0) {
    pSVar3 = (ShaderElementData *)0x0;
  }
  else {
    Element::GetRenderBox(&render_box,element,paint_area,0);
    dimensions = render_box.fill_size;
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"shader",&local_191);
    Variant::Variant<std::__cxx11::string_const&,void>((Variant *)local_178,&this->value);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[6],_Rml::Variant,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
                *)&mesh,(char (*) [6])0x31c259,(Variant *)local_178);
    Variant::Variant<Rml::Vector2<float>const&,void>(&local_80,&dimensions);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[11],_Rml::Variant,_true>(&local_d0,(char (*) [11])"dimensions",&local_80);
    init._M_len = 2;
    init._M_array = (iterator)&mesh;
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                *)(local_178 + 0x28),init,&local_192,&local_193);
    RenderManager::CompileShader((RenderManager *)&shader,(String *)mesh_00,&local_138);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
               *)(local_178 + 0x28));
    lVar4 = 0x48;
    do {
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
               *)((long)&mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + -0x48;
    } while (lVar4 != -0x48);
    Variant::~Variant(&local_80);
    Variant::~Variant((Variant *)local_178);
    ::std::__cxx11::string::~string((string *)&local_138);
    if (shader.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle
        == 0) {
      pSVar3 = (ShaderElementData *)0x0;
    }
    else {
      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pCVar1 = Element::GetComputedValues(element);
      MeshUtilities::GenerateBackground
                (&mesh,&render_box,
                 (ColourbPremultiplied)
                 (((int)((pCVar1->inherited).opacity * 255.0) & 0xffU) * 0x1010101));
      for (pVVar2 = mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pVVar2 != mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pVVar2 = pVVar2 + 1) {
        auVar5._0_4_ = (pVVar2->position).x - render_box.border_widths._M_elems[3];
        auVar5._4_4_ = (pVVar2->position).y - render_box.border_widths._M_elems[0];
        auVar5._8_4_ = 0.0 - render_box.border_radius._M_elems[1];
        auVar5._12_4_ = 0.0 - render_box.border_radius._M_elems[2];
        auVar6._8_8_ = 0;
        auVar6._0_4_ = dimensions.x;
        auVar6._4_4_ = dimensions.y;
        auVar6 = divps(auVar5,auVar6);
        pVVar2->tex_coord = auVar6._0_8_;
      }
      GetShaderElementDataPool();
      RenderManager::MakeGeometry((RenderManager *)local_178,(Mesh *)mesh_00);
      pSVar3 = Pool<Rml::ShaderElementData>::AllocateAndConstruct<Rml::Geometry,Rml::CompiledShader>
                         (&GetShaderElementDataPool::gradient_element_data_pool,
                          (Geometry *)local_178,&shader);
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::~UniqueRenderResource
                ((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                  *)local_178);
      Mesh::~Mesh(&mesh);
    }
    UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>::~UniqueRenderResource
              (&shader.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>);
  }
  return (DecoratorDataHandle)pSVar3;
}

Assistant:

DecoratorDataHandle DecoratorShader::GenerateElementData(Element* element, BoxArea paint_area) const
{
	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return INVALID_DECORATORDATAHANDLE;

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f dimensions = render_box.GetFillSize();
	CompiledShader shader = render_manager->CompileShader("shader", Dictionary{{"value", Variant(value)}, {"dimensions", Variant(dimensions)}});
	if (!shader)
		return INVALID_DECORATORDATAHANDLE;

	Mesh mesh;

	const ComputedValues& computed = element->GetComputedValues();
	const byte alpha = byte(computed.opacity() * 255.f);
	MeshUtilities::GenerateBackground(mesh, render_box, ColourbPremultiplied(alpha, alpha));

	const Vector2f offset = render_box.GetFillOffset();
	for (Vertex& vertex : mesh.vertices)
		vertex.tex_coord = (vertex.position - offset) / dimensions;

	ShaderElementData* element_data =
		GetShaderElementDataPool().AllocateAndConstruct(render_manager->MakeGeometry(std::move(mesh)), std::move(shader));

	return reinterpret_cast<DecoratorDataHandle>(element_data);
}